

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passpredict.cc
# Opt level: O0

DateTime FindCrossingPoint(CoordGeodetic *user_geo,SGP4 *sgp4,DateTime *initial_time1,
                          DateTime *initial_time2,bool finding_aos)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  undefined1 local_1b0 [8];
  CoordTopocentric topo_1;
  Eci eci_1;
  TimeSpan TStack_130;
  int us;
  undefined1 local_128 [8];
  CoordTopocentric topo;
  Eci eci;
  DateTime local_b0;
  DateTime time2;
  DateTime time1;
  int cnt;
  bool running;
  Observer obs;
  bool finding_aos_local;
  DateTime *initial_time2_local;
  DateTime *initial_time1_local;
  SGP4 *sgp4_local;
  CoordGeodetic *user_geo_local;
  DateTime middle_time;
  
  obs.m_eci.m_velocity.w._7_1_ = finding_aos;
  libsgp4::Observer::Observer((Observer *)&cnt,user_geo);
  time2 = (DateTime)initial_time1->m_encoded;
  local_b0 = (DateTime)initial_time2->m_encoded;
  libsgp4::DateTime::DateTime((DateTime *)&user_geo_local);
  bVar1 = true;
  time1.m_encoded._0_4_ = 0;
  while( true ) {
    iVar2 = (int)time1.m_encoded;
    if (bVar1) {
      time1.m_encoded._0_4_ = (int)time1.m_encoded + 1;
    }
    if (!bVar1 || 0xf < iVar2) break;
    eci.m_velocity.w = (double)libsgp4::operator-(&local_b0,&time2);
    dVar3 = libsgp4::TimeSpan::TotalSeconds((TimeSpan *)&eci.m_velocity.w);
    user_geo_local = (CoordGeodetic *)libsgp4::DateTime::AddSeconds(&time2,dVar3 / 2.0);
    libsgp4::SGP4::FindPosition((Eci *)&topo.range_rate,sgp4,(DateTime *)&user_geo_local);
    libsgp4::Observer::GetLookAngle
              ((CoordTopocentric *)local_128,(Observer *)&cnt,(Eci *)&topo.range_rate);
    if (topo.azimuth <= 0.0) {
      if ((obs.m_eci.m_velocity.w._7_1_ & 1) == 0) {
        local_b0.m_encoded = (int64_t)user_geo_local;
      }
      else {
        time2.m_encoded = (int64_t)user_geo_local;
      }
    }
    else if ((obs.m_eci.m_velocity.w._7_1_ & 1) == 0) {
      time2.m_encoded = (int64_t)user_geo_local;
    }
    else {
      local_b0.m_encoded = (int64_t)user_geo_local;
    }
    TStack_130 = libsgp4::operator-(&local_b0,&time2);
    dVar3 = libsgp4::TimeSpan::TotalSeconds(&stack0xfffffffffffffed0);
    if (dVar3 < 1.0) {
      bVar1 = false;
      iVar2 = libsgp4::DateTime::Microsecond((DateTime *)&user_geo_local);
      user_geo_local =
           (CoordGeodetic *)
           libsgp4::DateTime::AddMicroseconds((DateTime *)&user_geo_local,(double)-iVar2);
      iVar2 = -1;
      if ((obs.m_eci.m_velocity.w._7_1_ & 1) != 0) {
        iVar2 = 1;
      }
      user_geo_local =
           (CoordGeodetic *)libsgp4::DateTime::AddSeconds((DateTime *)&user_geo_local,(double)iVar2)
      ;
    }
  }
  bVar1 = true;
  time1.m_encoded._0_4_ = 0;
  while( true ) {
    iVar2 = (int)time1.m_encoded;
    if (bVar1) {
      time1.m_encoded._0_4_ = (int)time1.m_encoded + 1;
    }
    if (!bVar1 || 5 < iVar2) break;
    libsgp4::SGP4::FindPosition((Eci *)&topo_1.range_rate,sgp4,(DateTime *)&user_geo_local);
    libsgp4::Observer::GetLookAngle
              ((CoordTopocentric *)local_1b0,(Observer *)&cnt,(Eci *)&topo_1.range_rate);
    if (topo_1.azimuth <= 0.0) {
      bVar1 = false;
    }
    else {
      iVar2 = 1;
      if ((obs.m_eci.m_velocity.w._7_1_ & 1) != 0) {
        iVar2 = -1;
      }
      user_geo_local =
           (CoordGeodetic *)libsgp4::DateTime::AddSeconds((DateTime *)&user_geo_local,(double)iVar2)
      ;
    }
  }
  return (DateTime)(int64_t)user_geo_local;
}

Assistant:

libsgp4::DateTime FindCrossingPoint(
        const libsgp4::CoordGeodetic& user_geo,
        libsgp4::SGP4& sgp4,
        const libsgp4::DateTime& initial_time1,
        const libsgp4::DateTime& initial_time2,
        bool finding_aos)
{
    libsgp4::Observer obs(user_geo);

    bool running;
    int cnt;

    libsgp4::DateTime time1(initial_time1);
    libsgp4::DateTime time2(initial_time2);
    libsgp4::DateTime middle_time;

    running = true;
    cnt = 0;
    while (running && cnt++ < 16)
    {
        middle_time = time1.AddSeconds((time2 - time1).TotalSeconds() / 2.0);
        /*
         * calculate satellite position
         */
        libsgp4::Eci eci = sgp4.FindPosition(middle_time);
        libsgp4::CoordTopocentric topo = obs.GetLookAngle(eci);

        if (topo.elevation > 0.0)
        {
            /*
             * satellite above horizon
             */
            if (finding_aos)
            {
                time2 = middle_time;
            }
            else
            {
                time1 = middle_time;
            }
        }
        else
        {
            if (finding_aos)
            {
                time1 = middle_time;
            }
            else
            {
                time2 = middle_time;
            }
        }

        if ((time2 - time1).TotalSeconds() < 1.0)
        {
            /*
             * two times are within a second, stop
             */
            running = false;
            /*
             * remove microseconds
             */
            int us = middle_time.Microsecond();
            middle_time = middle_time.AddMicroseconds(-us);
            /*
             * step back into the pass by 1 second
             */
            middle_time = middle_time.AddSeconds(finding_aos ? 1 : -1);
        }
    }

    /*
     * go back/forward 1second until below the horizon
     */
    running = true;
    cnt = 0;
    while (running && cnt++ < 6)
    {
        libsgp4::Eci eci = sgp4.FindPosition(middle_time);
        libsgp4::CoordTopocentric topo = obs.GetLookAngle(eci);
        if (topo.elevation > 0)
        {
            middle_time = middle_time.AddSeconds(finding_aos ? -1 : 1);
        }
        else
        {
            running = false;
        }
    }

    return middle_time;
}